

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::setAccelFsr(RTIMUMPU9250 *this,uchar fsr)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,fsr);
  switch(uVar1 << 0x1d | uVar1 >> 3) {
  case 0:
    this->m_accelFsr = fsr;
    this->m_accelScale = 6.1035156e-05;
    break;
  case 1:
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00012207031;
    break;
  case 2:
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00024414062;
    break;
  case 3:
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00048828125;
    break;
  default:
    fprintf(_stderr,"Illegal MPU9250 accel fsr %d\n");
    return false;
  }
  return true;
}

Assistant:

bool RTIMUMPU9250::setAccelFsr(unsigned char fsr)
{
    switch (fsr) {
    case MPU9250_ACCELFSR_2:
        m_accelFsr = fsr;
        m_accelScale = 1.0/16384.0;
        return true;

    case MPU9250_ACCELFSR_4:
        m_accelFsr = fsr;
        m_accelScale = 1.0/8192.0;
        return true;

    case MPU9250_ACCELFSR_8:
        m_accelFsr = fsr;
        m_accelScale = 1.0/4096.0;
        return true;

    case MPU9250_ACCELFSR_16:
        m_accelFsr = fsr;
        m_accelScale = 1.0/2048.0;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9250 accel fsr %d\n", fsr);
        return false;
    }
}